

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  BigFile local_28;
  BigFile bf;
  int opt;
  char **argv_local;
  int argc_local;
  
  while (bf.basename._4_4_ = getopt(argc,argv,"l"), bf.basename._4_4_ != -1) {
    if (bf.basename._4_4_ == 0x6c) {
      longfmt = 1;
    }
    else {
      usage();
    }
  }
  if (argc - _optind < 1) {
    usage();
  }
  iVar5 = _optind + -1;
  if (argc - _optind == 1) {
    listbigfile(argv[(long)iVar5 + 1]);
  }
  else {
    memset(&local_28,0,8);
    iVar2 = big_file_open(&local_28,argv[(long)iVar5 + 1]);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      pcVar4 = argv[(long)iVar5 + 1];
      pcVar3 = big_file_get_error_message();
      fprintf(pFVar1,"failed to open: %s : %s\n",pcVar4,pcVar3);
      exit(1);
    }
    iVar5 = listbigblock(&local_28,argv[(long)iVar5 + 2]);
    pFVar1 = _stderr;
    if (iVar5 != 0) {
      pcVar4 = big_file_get_error_message();
      fprintf(pFVar1,"failed to open: %s\n",pcVar4);
    }
    big_file_close(&local_28);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    int opt;
    while(-1 != (opt = getopt(argc, argv, "l"))) {
        switch(opt){
            case 'l':
                longfmt = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind < 1) {
        usage();
    }
    argv += optind - 1;
    if(argc - optind == 1) {
        listbigfile(argv[1]);
    } else {
        BigFile bf = {0};
        if(0 != big_file_open(&bf, argv[1])) {
            fprintf(stderr, "failed to open: %s : %s\n", argv[1], big_file_get_error_message());
            exit(1);
        }
        if(0 != listbigblock(&bf, argv[2])) {
            fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        }
        big_file_close(&bf);
    }
    return 0;
}